

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O0

int SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S,N_Vector s1,N_Vector s2)

{
  N_Vector s2_local;
  N_Vector s1_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(N_Vector *)((long)S->content + 0x48) = s1;
    *(N_Vector *)((long)S->content + 0x50) = s2;
    *(undefined8 *)((long)S->content + 0x18) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetScalingVectors_SPBCGS(SUNLinearSolver S, N_Vector s1,
                                      N_Vector s2)
{
  /* set N_Vector pointers to integrator-supplied scaling vectors, 
     and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPBCGS_CONTENT(S)->s1 = s1;
  SPBCGS_CONTENT(S)->s2 = s2;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}